

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O1

int sam_hdr_name2ref(SAM_hdr *hdr,char *ref)

{
  khint_t kVar1;
  uint uVar2;
  kh_m_s2i_t *pkVar3;
  khint32_t *pkVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  byte bVar8;
  char *pcVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  
  pkVar3 = hdr->ref_hash;
  kVar1 = pkVar3->n_buckets;
  if (kVar1 == 0) {
    uVar6 = 0;
  }
  else {
    uVar11 = (uint)*ref;
    if (*ref == '\0') {
      uVar11 = 0;
    }
    else {
      cVar5 = ref[1];
      if (cVar5 != '\0') {
        pcVar9 = ref + 2;
        do {
          uVar11 = (int)cVar5 + uVar11 * 0x1f;
          cVar5 = *pcVar9;
          pcVar9 = pcVar9 + 1;
        } while (cVar5 != '\0');
      }
    }
    uVar11 = uVar11 & kVar1 - 1;
    pkVar4 = pkVar3->flags;
    iVar10 = 1;
    uVar12 = uVar11;
    do {
      uVar2 = pkVar4[uVar12 >> 4];
      bVar8 = (char)uVar12 * '\x02' & 0x1e;
      uVar6 = uVar2 >> bVar8;
      if (((uVar6 & 2) != 0) ||
         (((uVar6 & 1) == 0 && (iVar7 = strcmp(pkVar3->keys[uVar12],ref), iVar7 == 0)))) {
        uVar6 = uVar12;
        if ((uVar2 >> bVar8 & 3) != 0) {
          uVar6 = kVar1;
        }
        break;
      }
      uVar12 = uVar12 + iVar10 & kVar1 - 1;
      iVar10 = iVar10 + 1;
      uVar6 = kVar1;
    } while (uVar12 != uVar11);
  }
  iVar10 = -1;
  if (uVar6 != kVar1) {
    iVar10 = pkVar3->vals[uVar6];
  }
  return iVar10;
}

Assistant:

int sam_hdr_name2ref(SAM_hdr *hdr, const char *ref) {
    khint_t k = kh_get(m_s2i, hdr->ref_hash, ref);
    return k == kh_end(hdr->ref_hash) ? -1 : kh_val(hdr->ref_hash, k);
}